

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__lookat(NodeLoader *this,lookat__AttributeData *attributeData)

{
  char *colladaSid;
  
  colladaSid = attributeData->sid;
  TransformationLoader::beginTransformation<COLLADAFW::Lookat>(&this->mTransformationLoader);
  IFilePartLoader::addToSidTree
            (&((this->super_HelperLoaderBase).mHandlingFilePartLoader)->super_IFilePartLoader,
             (char *)0x0,colladaSid,
             &((this->mTransformationLoader).mCurrentTransformation)->super_Animatable);
  return true;
}

Assistant:

bool NodeLoader::begin__lookat ( const lookat__AttributeData& attributeData )
	{
		return beginTransformation<COLLADAFW::Lookat>( attributeData.sid );
	}